

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

_Bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,float secs)

{
  _func_void *p_Var1;
  _Bool _Var2;
  ALLEGRO_SYSTEM *pAVar3;
  ALLEGRO_TIMEOUT timeout;
  ALLEGRO_TIMEOUT local_28;
  
  pAVar3 = al_get_system_driver();
  p_Var1 = pAVar3->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  al_init_timeout(&local_28,(double)(float)(~-(uint)(secs <= 0.0) & (uint)secs));
  _Var2 = do_wait_for_event(queue,ret_event,&local_28);
  return _Var2;
}

Assistant:

bool al_wait_for_event_timed(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, float secs)
{
   ALLEGRO_TIMEOUT timeout;

   ASSERT(queue);
   ASSERT(secs >= 0);

   heartbeat();

   if (secs < 0.0)
      al_init_timeout(&timeout, 0);
   else
      al_init_timeout(&timeout, secs);

   return do_wait_for_event(queue, ret_event, &timeout);
}